

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall
Eigen::internal::
gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
::operator()(gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
             *this,double *blockA,const_blas_data_mapper<double,_long,_1> *lhs,long depth,long rows,
            long stride,long offset)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  long lVar6;
  double (*from) [2];
  double *pdVar7;
  int iVar8;
  long in_RCX;
  long lVar9;
  long *in_RDX;
  long in_RSI;
  long in_R8;
  long in_R9;
  double extraout_XMM0_Qb;
  Packet2d adVar10;
  long in_stack_00000008;
  long k_1;
  double d;
  double c;
  double b;
  double a;
  long w;
  int p_1;
  int p;
  PacketBlock<__attribute__((__vector_size__(2_*_sizeof(double))))_double,_2> kernel;
  long m;
  long k;
  long peeled_k;
  long peeled_mc;
  long remaining_rows;
  long i;
  int pack;
  long count;
  conj_if<false> cj;
  long local_1a0;
  long local_178;
  int local_170;
  int local_16c;
  PacketBlock<__attribute__((__vector_size__(2_*_sizeof(double))))_double,_2> local_168;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  int local_10c;
  long local_108;
  conj_if<false> local_f9;
  long local_f8;
  long local_f0;
  long local_e8;
  long *local_e0;
  long local_d8;
  long local_c8;
  long local_c0;
  long *local_b8;
  double *local_b0;
  long local_a8;
  long local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long *local_80;
  long local_78;
  long local_70;
  long *local_68;
  long local_60;
  long local_58;
  long *local_50;
  long local_48;
  long local_40;
  long *local_38;
  long local_30;
  long local_28;
  long *local_20;
  long local_18;
  long local_10;
  long *local_8;
  
  local_f8 = in_R9;
  local_f0 = in_R8;
  local_e8 = in_RCX;
  local_e0 = in_RDX;
  local_d8 = in_RSI;
  ignore_unused_variable<long>(&local_f8);
  ignore_unused_variable<long>(&stack0x00000008);
  if ((local_f8 != 0) || (bVar5 = true, in_stack_00000008 != 0)) {
    bVar5 = false;
  }
  if (bVar5) {
    local_108 = 0;
    local_10c = 4;
    local_118 = 0;
    while (0 < local_10c) {
      local_120 = local_f0 - local_118;
      local_128 = local_118 + (local_120 / (long)local_10c) * (long)local_10c;
      for (; local_118 < local_128; local_118 = local_10c + local_118) {
        local_130 = local_e8 / 2 << 1;
        local_138 = 0;
        if (1 < local_10c) {
          for (; local_138 < local_130; local_138 = local_138 + 2) {
            for (local_140 = 0; local_140 < local_10c; local_140 = local_140 + 2) {
              for (local_16c = 0; local_16c < 2; local_16c = local_16c + 1) {
                local_c0 = local_118 + local_16c + local_140;
                local_b8 = local_e0;
                local_c8 = local_138;
                local_98 = local_e0;
                local_a8 = local_138;
                local_b0 = (double *)(*local_e0 + (local_138 + local_c0 * local_e0[1]) * 8);
                local_a0 = local_c0;
                adVar10 = ploadu<double__vector(2)>(local_b0);
                local_168.packet[local_16c][0] = adVar10[0];
                local_168.packet[local_16c][1] = extraout_XMM0_Qb;
              }
              ptranspose(&local_168);
              for (local_170 = 0; local_170 < 2; local_170 = local_170 + 1) {
                lVar6 = local_d8 + local_108 * 8;
                lVar9 = local_140 * 8;
                iVar8 = local_10c * local_170;
                from = conj_if<false>::pconj<double__vector(2)>
                                 (&local_f9,local_168.packet + local_170);
                pstore<double,double__vector(2)>((double *)(lVar6 + lVar9 + (long)iVar8 * 8),from);
              }
            }
            local_108 = (local_10c << 1) + local_108;
          }
        }
        for (; local_138 < local_e8; local_138 = local_138 + 1) {
          for (local_178 = 0; local_178 < local_10c + -3; local_178 = local_178 + 4) {
            local_10 = local_118 + local_178;
            local_8 = local_e0;
            local_18 = local_138;
            pdVar7 = conj_if<false>::operator()
                               (&local_f9,
                                (double *)(*local_e0 + (local_138 + local_10 * local_e0[1]) * 8));
            dVar1 = *pdVar7;
            local_28 = local_118 + local_178 + 1;
            local_20 = local_e0;
            local_30 = local_138;
            pdVar7 = conj_if<false>::operator()
                               (&local_f9,
                                (double *)(*local_e0 + (local_138 + local_28 * local_e0[1]) * 8));
            dVar2 = *pdVar7;
            local_40 = local_118 + local_178 + 2;
            local_38 = local_e0;
            local_48 = local_138;
            pdVar7 = conj_if<false>::operator()
                               (&local_f9,
                                (double *)(*local_e0 + (local_138 + local_40 * local_e0[1]) * 8));
            dVar3 = *pdVar7;
            local_58 = local_118 + local_178 + 3;
            local_50 = local_e0;
            local_60 = local_138;
            pdVar7 = conj_if<false>::operator()
                               (&local_f9,
                                (double *)(*local_e0 + (local_138 + local_58 * local_e0[1]) * 8));
            dVar4 = *pdVar7;
            *(double *)(local_d8 + local_108 * 8) = dVar1;
            *(double *)(local_d8 + (local_108 + 1) * 8) = dVar2;
            lVar6 = local_108 + 3;
            *(double *)(local_d8 + (local_108 + 2) * 8) = dVar3;
            local_108 = local_108 + 4;
            *(double *)(local_d8 + lVar6 * 8) = dVar4;
          }
          if (local_10c % 4 != 0) {
            for (; local_178 < local_10c; local_178 = local_178 + 1) {
              local_70 = local_118 + local_178;
              local_68 = local_e0;
              local_78 = local_138;
              pdVar7 = conj_if<false>::operator()
                                 (&local_f9,
                                  (double *)(*local_e0 + (local_138 + local_70 * local_e0[1]) * 8));
              *(double *)(local_d8 + local_108 * 8) = *pdVar7;
              local_108 = local_108 + 1;
            }
          }
        }
      }
      local_10c = local_10c + -2;
      if ((local_10c < 2) && (local_10c != 0)) {
        local_10c = 2;
      }
    }
    for (; local_118 < local_f0; local_118 = local_118 + 1) {
      for (local_1a0 = 0; local_1a0 < local_e8; local_1a0 = local_1a0 + 1) {
        local_80 = local_e0;
        local_88 = local_118;
        local_90 = local_1a0;
        pdVar7 = conj_if<false>::operator()
                           (&local_f9,
                            (double *)(*local_e0 + (local_1a0 + local_118 * local_e0[1]) * 8));
        *(double *)(local_d8 + local_108 * 8) = *pdVar7;
        local_108 = local_108 + 1;
      }
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x71c,
                "void Eigen::internal::gemm_pack_lhs<double, long, Eigen::internal::const_blas_data_mapper<double, long, 1>, 4, 2, 1>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<double, long, 1>, Pack1 = 4, Pack2 = 2, StorageOrder = 1, Conjugate = false, PanelMode = false]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_lhs<Scalar, Index, DataMapper, Pack1, Pack2, RowMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockA, const DataMapper& lhs, Index depth, Index rows, Index stride, Index offset)
{
  typedef typename packet_traits<Scalar>::type Packet;
  enum { PacketSize = packet_traits<Scalar>::size };

  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK LHS");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index count = 0;

//   const Index peeled_mc3 = Pack1>=3*PacketSize ? (rows/(3*PacketSize))*(3*PacketSize) : 0;
//   const Index peeled_mc2 = Pack1>=2*PacketSize ? peeled_mc3+((rows-peeled_mc3)/(2*PacketSize))*(2*PacketSize) : 0;
//   const Index peeled_mc1 = Pack1>=1*PacketSize ? (rows/(1*PacketSize))*(1*PacketSize) : 0;

  int pack = Pack1;
  Index i = 0;
  while(pack>0)
  {
    Index remaining_rows = rows-i;
    Index peeled_mc = i+(remaining_rows/pack)*pack;
    for(; i<peeled_mc; i+=pack)
    {
      if(PanelMode) count += pack * offset;

      const Index peeled_k = (depth/PacketSize)*PacketSize;
      Index k=0;
      if(pack>=PacketSize)
      {
        for(; k<peeled_k; k+=PacketSize)
        {
          for (Index m = 0; m < pack; m += PacketSize)
          {
            PacketBlock<Packet> kernel;
            for (int p = 0; p < PacketSize; ++p) kernel.packet[p] = lhs.loadPacket(i+p+m, k);
            ptranspose(kernel);
            for (int p = 0; p < PacketSize; ++p) pstore(blockA+count+m+(pack)*p, cj.pconj(kernel.packet[p]));
          }
          count += PacketSize*pack;
        }
      }
      for(; k<depth; k++)
      {
        Index w=0;
        for(; w<pack-3; w+=4)
        {
          Scalar a(cj(lhs(i+w+0, k))),
                 b(cj(lhs(i+w+1, k))),
                 c(cj(lhs(i+w+2, k))),
                 d(cj(lhs(i+w+3, k)));
          blockA[count++] = a;
          blockA[count++] = b;
          blockA[count++] = c;
          blockA[count++] = d;
        }
        if(pack%4)
          for(;w<pack;++w)
            blockA[count++] = cj(lhs(i+w, k));
      }

      if(PanelMode) count += pack * (stride-offset-depth);
    }

    pack -= PacketSize;
    if(pack<Pack2 && (pack+PacketSize)!=Pack2)
      pack = Pack2;
  }

  for(; i<rows; i++)
  {
    if(PanelMode) count += offset;
    for(Index k=0; k<depth; k++)
      blockA[count++] = cj(lhs(i, k));
    if(PanelMode) count += (stride-offset-depth);
  }
}